

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O2

void helix_session_set_send_callback(helix_session_t session,helix_send_callback_t callback)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<void_(char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:109:40)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:109:40)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)session;
  local_28._8_8_ = callback;
  (**(code **)(*(long *)session + 0x28))(session,&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void helix_session_set_send_callback(helix_session_t session, helix_send_callback_t callback)
{
    unwrap(session)->set_send_callback([session, callback](char* base, size_t len) {
        callback(session, base, len);
    });
}